

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstring.cpp
# Opt level: O1

void __thiscall TPZString::SimplifyWhiteSpace(TPZString *this)

{
  uint uVar1;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  char *pcVar7;
  char cVar8;
  uint uVar9;
  
  if ((this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.fNElements ==
      0) {
    uVar1 = 0xffffffff;
  }
  else {
    sVar2 = strlen((this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.
                   fStore);
    uVar1 = (int)sVar2 - 1;
  }
  uVar4 = 0;
  if (uVar1 != 0) {
    uVar5 = uVar4;
    uVar4 = 0;
    do {
      pcVar7 = (this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.
               fStore;
      iVar3 = (int)uVar5;
      cVar8 = pcVar7[uVar5];
      iVar6 = (int)uVar4;
      if (cVar8 == ' ') {
        if (iVar3 != 0) {
          pcVar7[uVar4] = ' ';
          uVar4 = (ulong)(iVar6 + 1);
        }
        pcVar7 = (this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.
                 fStore;
        uVar9 = iVar3 + 1;
        while( true ) {
          iVar3 = (int)uVar5;
          cVar8 = pcVar7[uVar9];
          if (cVar8 != ' ') break;
          uVar5 = (ulong)(iVar3 + 1);
          uVar9 = iVar3 + 2;
        }
LAB_00b093e0:
        iVar6 = (int)uVar4;
        pcVar7[uVar4] = cVar8;
      }
      else if (iVar6 != iVar3) goto LAB_00b093e0;
      uVar4 = (ulong)(iVar6 + 1);
      uVar5 = (ulong)(iVar3 + 1U);
    } while (iVar3 + 1U < uVar1);
  }
  (this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.fStore[uVar4] =
       '\0';
  return;
}

Assistant:

void TPZString::SimplifyWhiteSpace()
{
	unsigned int i, newpos = 0;
	const unsigned int length = Length();
	char current = '0', next = '0';
	for (i = 0; i < length - 1; i++)
	{
		current = fStore[i];
		if (current == ' ')
		{
			if (i)
			{
				fStore[newpos] = ' ';
				newpos++;
			}
			next = fStore[i + 1];
			while (next == ' ')
			{
				i++;
				next = fStore[i + 1];
			}
			fStore[newpos] = next;
			newpos++;
		}
		else
		{
			if (newpos != i) fStore[newpos] = current;
			newpos++;
		}
	}
	fStore[newpos] = '\0';
}